

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

Token lexRawToken(string_view text)

{
  SourceBuffer buffer_00;
  SourceManager *this;
  StringRef capturedExpression;
  StringRef macroName;
  Token token;
  SourceLineInfo local_3c8;
  AssertionHandler catchAssertionHandler;
  LexerOptions local_370;
  SourceBuffer buffer;
  Lexer lexer;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)&slang::diagnostics);
  this = getSourceManager();
  slang::SourceManager::assignText(&buffer,this,text,(SourceLocation)0x0,(SourceLibrary *)0x0);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::unordered_flat_map(&local_370.commentHandlers);
  local_370.maxErrors = 0x10;
  local_370.languageVersion = Default;
  local_370.enableLegacyProtect = false;
  buffer_00.data._M_str = buffer.data._M_str;
  buffer_00.data._M_len = buffer.data._M_len;
  buffer_00.library = buffer.library;
  buffer_00.id.id = buffer.id.id;
  buffer_00._28_4_ = buffer._28_4_;
  slang::parsing::Lexer::Lexer
            (&lexer,buffer_00,(BumpAllocator *)slang::alloc,(Diagnostics *)&slang::diagnostics,this,
             &local_370);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_370);
  token = slang::parsing::Lexer::lex(&lexer);
  local_3c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_3c8.line = 0x65;
  capturedExpression.m_size = 5;
  capturedExpression.m_start = "token";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_3c8,capturedExpression,Normal);
  local_3c8.file = (char *)&token;
  Catch::AssertionHandler::handleExpr<slang::parsing::Token&>
            (&catchAssertionHandler,(ExprLhs<slang::parsing::Token_&> *)&local_3c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  slang::parsing::Lexer::~Lexer(&lexer);
  return token;
}

Assistant:

Token lexRawToken(std::string_view text) {
    diagnostics.clear();
    auto& sm = getSourceManager();
    auto buffer = sm.assignText(text);
    Lexer lexer(buffer, alloc, diagnostics, sm);

    Token token = lexer.lex();
    REQUIRE(token);
    return token;
}